

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshints.c
# Opt level: O0

void cf2_glyphpath_pushPrevElem
               (CF2_GlyphPath glyphpath,CF2_HintMap hintmap,FT_Vector *nextP0,FT_Vector nextP1,
               FT_Bool close)

{
  FT_Bool local_a9;
  undefined1 auStack_a8 [7];
  FT_Bool useIntersection;
  FT_Vector intersection;
  FT_Vector *prevP1;
  FT_Vector *prevP0;
  CF2_CallbackParamsRec params;
  FT_Bool close_local;
  FT_Vector *nextP0_local;
  CF2_HintMap hintmap_local;
  CF2_GlyphPath glyphpath_local;
  FT_Vector nextP1_local;
  
  nextP1_local.x = nextP1.y;
  glyphpath_local = (CF2_GlyphPath)nextP1.x;
  memset(auStack_a8,0,0x10);
  local_a9 = '\0';
  if (glyphpath->prevElemOp == 2) {
    prevP1 = &glyphpath->prevElemP0;
    intersection.y = (FT_Pos)&glyphpath->prevElemP1;
  }
  else {
    prevP1 = &glyphpath->prevElemP2;
    intersection.y = (FT_Pos)&glyphpath->prevElemP3;
  }
  if (((*(long *)intersection.y != nextP0->x) || (*(long *)(intersection.y + 8) != nextP0->y)) &&
     (local_a9 = cf2_glyphpath_computeIntersection
                           (glyphpath,prevP1,(FT_Vector *)intersection.y,nextP0,
                            (FT_Vector *)&glyphpath_local,(FT_Vector *)auStack_a8), local_a9 != '\0'
     )) {
    *(FT_Pos *)intersection.y = _auStack_a8;
    *(FT_Pos *)(intersection.y + 8) = intersection.x;
  }
  prevP0 = (FT_Vector *)(glyphpath->currentDS).x;
  params.pt0.x = (glyphpath->currentDS).y;
  if (glyphpath->prevElemOp == 2) {
    params.pt3.y._0_4_ = 2;
    if (close == '\0') {
      cf2_glyphpath_hintPoint
                (glyphpath,hintmap,(FT_Vector *)&params.pt0.y,
                 (CF2_F16Dot16)(glyphpath->prevElemP1).x,(CF2_F16Dot16)(glyphpath->prevElemP1).y);
    }
    else {
      cf2_glyphpath_hintPoint
                (glyphpath,&glyphpath->firstHintMap,(FT_Vector *)&params.pt0.y,
                 (CF2_F16Dot16)(glyphpath->prevElemP1).x,(CF2_F16Dot16)(glyphpath->prevElemP1).y);
    }
    if ((prevP0 != (FT_Vector *)params.pt0.y) || (params.pt0.x != params.pt1.x)) {
      (*glyphpath->callbacks->lineTo)(glyphpath->callbacks,(CF2_CallbackParams)&prevP0);
      (glyphpath->currentDS).x = params.pt0.y;
      (glyphpath->currentDS).y = params.pt1.x;
    }
  }
  else if (glyphpath->prevElemOp == 4) {
    params.pt3.y._0_4_ = 4;
    cf2_glyphpath_hintPoint
              (glyphpath,hintmap,(FT_Vector *)&params.pt0.y,(CF2_F16Dot16)(glyphpath->prevElemP1).x,
               (CF2_F16Dot16)(glyphpath->prevElemP1).y);
    cf2_glyphpath_hintPoint
              (glyphpath,hintmap,(FT_Vector *)&params.pt1.y,(CF2_F16Dot16)(glyphpath->prevElemP2).x,
               (CF2_F16Dot16)(glyphpath->prevElemP2).y);
    cf2_glyphpath_hintPoint
              (glyphpath,hintmap,(FT_Vector *)&params.pt2.y,(CF2_F16Dot16)(glyphpath->prevElemP3).x,
               (CF2_F16Dot16)(glyphpath->prevElemP3).y);
    (*glyphpath->callbacks->cubeTo)(glyphpath->callbacks,(CF2_CallbackParams)&prevP0);
    (glyphpath->currentDS).x = params.pt2.y;
    (glyphpath->currentDS).y = params.pt3.x;
  }
  if ((local_a9 == '\0') || (close != '\0')) {
    if (close == '\0') {
      cf2_glyphpath_hintPoint
                (glyphpath,hintmap,(FT_Vector *)&params.pt0.y,(CF2_F16Dot16)nextP0->x,
                 (CF2_F16Dot16)nextP0->y);
    }
    else {
      cf2_glyphpath_hintPoint
                (glyphpath,&glyphpath->firstHintMap,(FT_Vector *)&params.pt0.y,
                 (CF2_F16Dot16)nextP0->x,(CF2_F16Dot16)nextP0->y);
    }
    if ((params.pt0.y != (glyphpath->currentDS).x) || (params.pt1.x != (glyphpath->currentDS).y)) {
      params.pt3.y._0_4_ = 2;
      prevP0 = (FT_Vector *)(glyphpath->currentDS).x;
      params.pt0.x = (glyphpath->currentDS).y;
      (*glyphpath->callbacks->lineTo)(glyphpath->callbacks,(CF2_CallbackParams)&prevP0);
      (glyphpath->currentDS).x = params.pt0.y;
      (glyphpath->currentDS).y = params.pt1.x;
    }
  }
  if (local_a9 != '\0') {
    nextP0->x = _auStack_a8;
    nextP0->y = intersection.x;
  }
  return;
}

Assistant:

static void
  cf2_glyphpath_pushPrevElem( CF2_GlyphPath  glyphpath,
                              CF2_HintMap    hintmap,
                              FT_Vector*     nextP0,
                              FT_Vector      nextP1,
                              FT_Bool        close )
  {
    CF2_CallbackParamsRec  params;

    FT_Vector*  prevP0;
    FT_Vector*  prevP1;

    FT_Vector  intersection    = { 0, 0 };
    FT_Bool    useIntersection = FALSE;


    FT_ASSERT( glyphpath->prevElemOp == CF2_PathOpLineTo ||
               glyphpath->prevElemOp == CF2_PathOpCubeTo );

    if ( glyphpath->prevElemOp == CF2_PathOpLineTo )
    {
      prevP0 = &glyphpath->prevElemP0;
      prevP1 = &glyphpath->prevElemP1;
    }
    else
    {
      prevP0 = &glyphpath->prevElemP2;
      prevP1 = &glyphpath->prevElemP3;
    }

    /* optimization: if previous and next elements are offset by the same */
    /* amount, then there will be no gap, and no need to compute an       */
    /* intersection.                                                      */
    if ( prevP1->x != nextP0->x || prevP1->y != nextP0->y )
    {
      /* previous element does not join next element:             */
      /* adjust end point of previous element to the intersection */
      useIntersection = cf2_glyphpath_computeIntersection( glyphpath,
                                                           prevP0,
                                                           prevP1,
                                                           nextP0,
                                                           &nextP1,
                                                           &intersection );
      if ( useIntersection )
      {
        /* modify the last point of the cached element (either line or */
        /* curve)                                                      */
        *prevP1 = intersection;
      }
    }

    params.pt0 = glyphpath->currentDS;

    switch( glyphpath->prevElemOp )
    {
    case CF2_PathOpLineTo:
      params.op = CF2_PathOpLineTo;

      /* note: pt2 and pt3 are unused */

      if ( close )
      {
        /* use first hint map if closing */
        cf2_glyphpath_hintPoint( glyphpath,
                                 &glyphpath->firstHintMap,
                                 &params.pt1,
                                 glyphpath->prevElemP1.x,
                                 glyphpath->prevElemP1.y );
      }
      else
      {
        cf2_glyphpath_hintPoint( glyphpath,
                                 hintmap,
                                 &params.pt1,
                                 glyphpath->prevElemP1.x,
                                 glyphpath->prevElemP1.y );
      }

      /* output only non-zero length lines */
      if ( params.pt0.x != params.pt1.x || params.pt0.y != params.pt1.y )
      {
        glyphpath->callbacks->lineTo( glyphpath->callbacks, &params );

        glyphpath->currentDS = params.pt1;
      }
      break;

    case CF2_PathOpCubeTo:
      params.op = CF2_PathOpCubeTo;

      /* TODO: should we intersect the interior joins (p1-p2 and p2-p3)? */
      cf2_glyphpath_hintPoint( glyphpath,
                               hintmap,
                               &params.pt1,
                               glyphpath->prevElemP1.x,
                               glyphpath->prevElemP1.y );
      cf2_glyphpath_hintPoint( glyphpath,
                               hintmap,
                               &params.pt2,
                               glyphpath->prevElemP2.x,
                               glyphpath->prevElemP2.y );
      cf2_glyphpath_hintPoint( glyphpath,
                               hintmap,
                               &params.pt3,
                               glyphpath->prevElemP3.x,
                               glyphpath->prevElemP3.y );

      glyphpath->callbacks->cubeTo( glyphpath->callbacks, &params );

      glyphpath->currentDS = params.pt3;

      break;
    }

    if ( !useIntersection || close )
    {
      /* insert connecting line between end of previous element and start */
      /* of current one                                                   */
      /* note: at the end of a subpath, we might do both, so use `nextP0' */
      /* before we change it, below                                       */

      if ( close )
      {
        /* if we are closing the subpath, then nextP0 is in the first     */
        /* hint zone                                                      */
        cf2_glyphpath_hintPoint( glyphpath,
                                 &glyphpath->firstHintMap,
                                 &params.pt1,
                                 nextP0->x,
                                 nextP0->y );
      }
      else
      {
        cf2_glyphpath_hintPoint( glyphpath,
                                 hintmap,
                                 &params.pt1,
                                 nextP0->x,
                                 nextP0->y );
      }

      if ( params.pt1.x != glyphpath->currentDS.x ||
           params.pt1.y != glyphpath->currentDS.y )
      {
        /* length is nonzero */
        params.op  = CF2_PathOpLineTo;
        params.pt0 = glyphpath->currentDS;

        /* note: pt2 and pt3 are unused */
        glyphpath->callbacks->lineTo( glyphpath->callbacks, &params );

        glyphpath->currentDS = params.pt1;
      }
    }

    if ( useIntersection )
    {
      /* return intersection point to caller */
      *nextP0 = intersection;
    }
  }